

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.cpp
# Opt level: O1

int __thiscall CNetObjHandler::ValidateObj(CNetObjHandler *this,int Type,void *pData,int Size)

{
  int iVar1;
  char *pcVar2;
  uint uVar3;
  bool bVar4;
  
  iVar1 = -1;
  switch(Type) {
  case 1:
    if (Size != 0x28) {
      return -1;
    }
    if (*pData + 1U < 3) {
      if (1 < *(uint *)((long)pData + 0xc)) {
        pcVar2 = "m_Jump";
        goto LAB_001cf1a3;
      }
      if (1 < *(uint *)((long)pData + 0x14)) {
        pcVar2 = "m_Hook";
        goto LAB_001cf1a3;
      }
      if (0x7f < *(uint *)((long)pData + 0x18)) {
        pcVar2 = "m_PlayerFlags";
        goto LAB_001cf1a3;
      }
      uVar3 = *(uint *)((long)pData + 0x1c);
      if (5 < uVar3) {
        this->m_pObjFailedOn = "m_WantedWeapon";
        this->m_NumObjFailures = this->m_NumObjFailures + 1;
      }
      bVar4 = uVar3 < 6;
      goto LAB_001cefee;
    }
    goto LAB_001cf022;
  case 2:
    if (Size != 0x18) {
      return -1;
    }
    if (5 < *(uint *)((long)pData + 0x10)) {
      pcVar2 = "m_Type";
      goto LAB_001cf1a3;
    }
    iVar1 = *(int *)((long)pData + 0x14);
    goto LAB_001cee9d;
  case 3:
    if (Size != 0x14) {
      return -1;
    }
    iVar1 = *(int *)((long)pData + 0x10);
LAB_001cee9d:
    if (-1 < iVar1) goto LAB_001cefc4;
    pcVar2 = "m_StartTick";
    break;
  case 4:
    if (Size != 0xc) {
      return -1;
    }
    uVar3 = *(uint *)((long)pData + 8);
    if (7 < uVar3) {
      pcVar2 = "m_Type";
LAB_001cedcc:
      this->m_pObjFailedOn = pcVar2;
      this->m_NumObjFailures = this->m_NumObjFailures + 1;
    }
    goto LAB_001cedd9;
  case 5:
    if (Size != 0xc) {
      return -1;
    }
    uVar3 = *(uint *)((long)pData + 8);
    if (1 < uVar3) {
      pcVar2 = "m_Team";
LAB_001ced53:
      this->m_pObjFailedOn = pcVar2;
      this->m_NumObjFailures = this->m_NumObjFailures + 1;
    }
    goto LAB_001ced60;
  case 6:
    if (Size != 0xc) {
      return -1;
    }
    if (*pData < 0) {
      pcVar2 = "m_GameStartTick";
      goto LAB_001cf1a3;
    }
    if (0x3f < *(uint *)((long)pData + 4)) {
      pcVar2 = "m_GameStateFlags";
      goto LAB_001cf1a3;
    }
    iVar1 = *(int *)((long)pData + 8);
    if (-1 < iVar1) goto LAB_001cefc4;
    pcVar2 = "m_GameStateEndTick";
    break;
  case 7:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
    bVar4 = Size == 8;
    goto LAB_001cebde;
  case 8:
    if (Size != 0x10) {
      return -1;
    }
    if (0x42 < *pData + 3U) {
      pcVar2 = "m_FlagCarrierRed";
      goto LAB_001cf1a3;
    }
    if (0x42 < *(int *)((long)pData + 4) + 3U) {
      pcVar2 = "m_FlagCarrierBlue";
      goto LAB_001cf1a3;
    }
    if (*(int *)((long)pData + 8) < 0) {
      pcVar2 = "m_FlagDropTickRed";
      goto LAB_001cf1a3;
    }
    iVar1 = *(int *)((long)pData + 0xc);
    if (-1 < iVar1) goto LAB_001cefc4;
    pcVar2 = "m_FlagDropTickBlue";
    break;
  case 9:
    if (Size != 0x3c) {
      return -1;
    }
    goto LAB_001cece7;
  case 10:
    if (Size != 0x58) {
      return -1;
    }
    if (10 < *(uint *)((long)pData + 0x3c)) {
      pcVar2 = "m_Health";
      goto LAB_001cf1a3;
    }
    if (10 < *(uint *)((long)pData + 0x40)) {
      pcVar2 = "m_Armor";
      goto LAB_001cf1a3;
    }
    if (5 < *(uint *)((long)pData + 0x48)) {
      pcVar2 = "m_Weapon";
      goto LAB_001cf1a3;
    }
    if (5 < *(uint *)((long)pData + 0x4c)) {
      pcVar2 = "m_Emote";
      goto LAB_001cf1a3;
    }
    if (*(int *)((long)pData + 0x50) < 0) {
      pcVar2 = "m_AttackTick";
      goto LAB_001cf1a3;
    }
    if (0x1f < *(uint *)((long)pData + 0x54)) {
      pcVar2 = "m_TriggeredEvents";
      goto LAB_001cf1a3;
    }
LAB_001cece7:
    if (*pData < 0) {
      pcVar2 = "m_Tick";
LAB_001cf1a3:
      this->m_pObjFailedOn = pcVar2;
      this->m_NumObjFailures = this->m_NumObjFailures + 1;
      return -1;
    }
    if (2 < *(int *)((long)pData + 0x18) + 1U) {
LAB_001cf022:
      pcVar2 = "m_Direction";
      goto LAB_001cf1a3;
    }
    if (3 < *(uint *)((long)pData + 0x1c)) {
      pcVar2 = "m_Jumped";
      goto LAB_001cf1a3;
    }
    if (0x40 < *(int *)((long)pData + 0x20) + 1U) {
      pcVar2 = "m_HookedPlayer";
      goto LAB_001cf1a3;
    }
    if (6 < *(int *)((long)pData + 0x24) + 1U) {
      pcVar2 = "m_HookState";
      goto LAB_001cf1a3;
    }
    iVar1 = *(int *)((long)pData + 0x28);
    if (-1 < iVar1) goto LAB_001cefc4;
    pcVar2 = "m_HookTick";
    break;
  case 0xb:
    if (Size != 0xc) {
      return -1;
    }
    uVar3 = *pData;
    if (0x7f < uVar3) {
      this->m_pObjFailedOn = "m_PlayerFlags";
      this->m_NumObjFailures = this->m_NumObjFailures + 1;
    }
    bVar4 = 0x7f < uVar3;
    goto LAB_001cebe1;
  case 0xc:
    if (Size != 0x10) {
      return -1;
    }
    if (*pData < 4) {
      uVar3 = *(int *)((long)pData + 4) - 0x40;
      if (uVar3 < 0xffffffbf) {
        this->m_pObjFailedOn = "m_SpectatorID";
        this->m_NumObjFailures = this->m_NumObjFailures + 1;
      }
      return -(uint)(uVar3 < 0xffffffbf);
    }
    pcVar2 = "m_SpecMode";
    goto LAB_001cf1a3;
  case 0xd:
    if (Size != 0xe8) {
      return -1;
    }
    if (1 < *pData) {
      pcVar2 = "m_Local";
      goto LAB_001cf1a3;
    }
    if (2 < *(int *)((long)pData + 4) + 1U) {
      pcVar2 = "m_Team";
      goto LAB_001cf1a3;
    }
    if (1 < *(uint *)((long)pData + 0xb8)) {
      pcVar2 = "m_aUseCustomColors[0]";
      goto LAB_001cf1a3;
    }
    if (1 < *(uint *)((long)pData + 0xbc)) {
      pcVar2 = "m_aUseCustomColors[1]";
      goto LAB_001cf1a3;
    }
    if (1 < *(uint *)((long)pData + 0xc0)) {
      pcVar2 = "m_aUseCustomColors[2]";
      goto LAB_001cf1a3;
    }
    if (1 < *(uint *)((long)pData + 0xc4)) {
      pcVar2 = "m_aUseCustomColors[3]";
      goto LAB_001cf1a3;
    }
    if (1 < *(uint *)((long)pData + 200)) {
      pcVar2 = "m_aUseCustomColors[4]";
      goto LAB_001cf1a3;
    }
    uVar3 = *(uint *)((long)pData + 0xcc);
    if (1 < uVar3) {
      pcVar2 = "m_aUseCustomColors[5]";
      goto LAB_001ced53;
    }
    goto LAB_001ced60;
  case 0xe:
    if (Size != 0x14) {
      return -1;
    }
    if (0xf < *pData) {
      pcVar2 = "m_GameFlags";
      goto LAB_001cf1a3;
    }
    if (*(int *)((long)pData + 4) < 0) {
      pcVar2 = "m_ScoreLimit";
      goto LAB_001cf1a3;
    }
    if (*(int *)((long)pData + 8) < 0) {
      pcVar2 = "m_TimeLimit";
      goto LAB_001cf1a3;
    }
    if (*(int *)((long)pData + 0xc) < 0) {
      pcVar2 = "m_MatchNum";
      goto LAB_001cf1a3;
    }
    iVar1 = *(int *)((long)pData + 0x10);
    if (-1 < iVar1) goto LAB_001cefc4;
    pcVar2 = "m_MatchCurrent";
    break;
  case 0xf:
    bVar4 = Size == 0x80;
LAB_001cebde:
    bVar4 = !bVar4;
LAB_001cebe1:
    return -(uint)bVar4;
  case 0x14:
    if (Size != 0xc) {
      return -1;
    }
    uVar3 = *(uint *)((long)pData + 8);
    if (0x3f < uVar3) {
      this->m_pObjFailedOn = "m_ClientID";
      this->m_NumObjFailures = this->m_NumObjFailures + 1;
    }
    bVar4 = uVar3 < 0x40;
    goto LAB_001cefee;
  case 0x15:
    if (Size != 0xc) {
      return -1;
    }
    uVar3 = *(uint *)((long)pData + 8);
    if (0x28 < uVar3) {
      this->m_pObjFailedOn = "m_SoundID";
      this->m_NumObjFailures = this->m_NumObjFailures + 1;
    }
    bVar4 = uVar3 < 0x29;
    goto LAB_001cefee;
  case 0x16:
    if (Size != 0x1c) {
      return -1;
    }
    if (0x3f < *(uint *)((long)pData + 8)) {
      pcVar2 = "m_ClientID";
      goto LAB_001cf1a3;
    }
    if (9 < *(uint *)((long)pData + 0x10)) {
      pcVar2 = "m_HealthAmount";
      goto LAB_001cf1a3;
    }
    if (9 < *(uint *)((long)pData + 0x14)) {
      pcVar2 = "m_ArmorAmount";
      goto LAB_001cf1a3;
    }
    uVar3 = *(uint *)((long)pData + 0x18);
    if (1 < uVar3) {
      pcVar2 = "m_Self";
      goto LAB_001ced53;
    }
LAB_001ced60:
    bVar4 = uVar3 < 2;
    goto LAB_001cefee;
  case 0x17:
    if (Size != 4) {
      return -1;
    }
    iVar1 = *pData;
    if (-1 < iVar1) goto LAB_001cefc4;
    pcVar2 = "m_RaceStartTick";
    break;
  case 0x18:
    if (Size != 0xc) {
      return -1;
    }
    if (*pData < -1) {
      pcVar2 = "m_BestTime";
      goto LAB_001cf1a3;
    }
    if (3 < *(uint *)((long)pData + 4)) {
      pcVar2 = "m_Precision";
      goto LAB_001cf1a3;
    }
    uVar3 = *(uint *)((long)pData + 8);
    if (7 < uVar3) {
      pcVar2 = "m_RaceFlags";
      goto LAB_001cedcc;
    }
LAB_001cedd9:
    bVar4 = uVar3 < 8;
LAB_001cefee:
    iVar1 = bVar4 - 1;
switchD_001cebd6_default:
    return iVar1;
  default:
    goto switchD_001cebd6_default;
  }
  this->m_pObjFailedOn = pcVar2;
  this->m_NumObjFailures = this->m_NumObjFailures + 1;
LAB_001cefc4:
  return iVar1 >> 0x1f;
}

Assistant:

int CNetObjHandler::ValidateObj(int Type, const void *pData, int Size)
{
	switch(Type)
	{
	case NETOBJTYPE_PLAYERINPUT:
	{
		const CNetObj_PlayerInput *pObj = (const CNetObj_PlayerInput *)pData;
		if(sizeof(*pObj) != Size) return -1;
		if(!CheckInt("m_Direction", pObj->m_Direction, -1, 1)) return -1;
		if(!CheckInt("m_Jump", pObj->m_Jump, 0, 1)) return -1;
		if(!CheckInt("m_Hook", pObj->m_Hook, 0, 1)) return -1;
		if(!CheckFlag("m_PlayerFlags", pObj->m_PlayerFlags, PLAYERFLAG_ADMIN|PLAYERFLAG_CHATTING|PLAYERFLAG_SCOREBOARD|PLAYERFLAG_READY|PLAYERFLAG_DEAD|PLAYERFLAG_WATCHING|PLAYERFLAG_BOT)) return -1;
		if(!CheckInt("m_WantedWeapon", pObj->m_WantedWeapon, 0, NUM_WEAPONS-1)) return -1;
		return 0;
	}
	
	case NETOBJTYPE_PROJECTILE:
	{
		const CNetObj_Projectile *pObj = (const CNetObj_Projectile *)pData;
		if(sizeof(*pObj) != Size) return -1;
		if(!CheckInt("m_Type", pObj->m_Type, 0, NUM_WEAPONS-1)) return -1;
		if(!CheckInt("m_StartTick", pObj->m_StartTick, 0, max_int)) return -1;
		return 0;
	}
	
	case NETOBJTYPE_LASER:
	{
		const CNetObj_Laser *pObj = (const CNetObj_Laser *)pData;
		if(sizeof(*pObj) != Size) return -1;
		if(!CheckInt("m_StartTick", pObj->m_StartTick, 0, max_int)) return -1;
		return 0;
	}
	
	case NETOBJTYPE_PICKUP:
	{
		const CNetObj_Pickup *pObj = (const CNetObj_Pickup *)pData;
		if(sizeof(*pObj) != Size) return -1;
		if(!CheckInt("m_Type", pObj->m_Type, 0, 7)) return -1;
		return 0;
	}
	
	case NETOBJTYPE_FLAG:
	{
		const CNetObj_Flag *pObj = (const CNetObj_Flag *)pData;
		if(sizeof(*pObj) != Size) return -1;
		if(!CheckInt("m_Team", pObj->m_Team, TEAM_RED, TEAM_BLUE)) return -1;
		return 0;
	}
	
	case NETOBJTYPE_GAMEDATA:
	{
		const CNetObj_GameData *pObj = (const CNetObj_GameData *)pData;
		if(sizeof(*pObj) != Size) return -1;
		if(!CheckInt("m_GameStartTick", pObj->m_GameStartTick, 0, max_int)) return -1;
		if(!CheckFlag("m_GameStateFlags", pObj->m_GameStateFlags, GAMESTATEFLAG_WARMUP|GAMESTATEFLAG_SUDDENDEATH|GAMESTATEFLAG_ROUNDOVER|GAMESTATEFLAG_GAMEOVER|GAMESTATEFLAG_PAUSED|GAMESTATEFLAG_STARTCOUNTDOWN)) return -1;
		if(!CheckInt("m_GameStateEndTick", pObj->m_GameStateEndTick, 0, max_int)) return -1;
		return 0;
	}
	
	case NETOBJTYPE_GAMEDATATEAM:
	{
		const CNetObj_GameDataTeam *pObj = (const CNetObj_GameDataTeam *)pData;
		if(sizeof(*pObj) != Size) return -1;
		return 0;
	}
	
	case NETOBJTYPE_GAMEDATAFLAG:
	{
		const CNetObj_GameDataFlag *pObj = (const CNetObj_GameDataFlag *)pData;
		if(sizeof(*pObj) != Size) return -1;
		if(!CheckInt("m_FlagCarrierRed", pObj->m_FlagCarrierRed, FLAG_MISSING, MAX_CLIENTS-1)) return -1;
		if(!CheckInt("m_FlagCarrierBlue", pObj->m_FlagCarrierBlue, FLAG_MISSING, MAX_CLIENTS-1)) return -1;
		if(!CheckInt("m_FlagDropTickRed", pObj->m_FlagDropTickRed, 0, max_int)) return -1;
		if(!CheckInt("m_FlagDropTickBlue", pObj->m_FlagDropTickBlue, 0, max_int)) return -1;
		return 0;
	}
	
	case NETOBJTYPE_CHARACTERCORE:
	{
		const CNetObj_CharacterCore *pObj = (const CNetObj_CharacterCore *)pData;
		if(sizeof(*pObj) != Size) return -1;
		if(!CheckInt("m_Tick", pObj->m_Tick, 0, max_int)) return -1;
		if(!CheckInt("m_Direction", pObj->m_Direction, -1, 1)) return -1;
		if(!CheckInt("m_Jumped", pObj->m_Jumped, 0, 3)) return -1;
		if(!CheckInt("m_HookedPlayer", pObj->m_HookedPlayer, -1, MAX_CLIENTS-1)) return -1;
		if(!CheckInt("m_HookState", pObj->m_HookState, -1, 5)) return -1;
		if(!CheckInt("m_HookTick", pObj->m_HookTick, 0, max_int)) return -1;
		return 0;
	}
	
	case NETOBJTYPE_CHARACTER:
	{
		const CNetObj_Character *pObj = (const CNetObj_Character *)pData;
		if(sizeof(*pObj) != Size) return -1;
		if(!CheckInt("m_Health", pObj->m_Health, 0, 10)) return -1;
		if(!CheckInt("m_Armor", pObj->m_Armor, 0, 10)) return -1;
		if(!CheckInt("m_Weapon", pObj->m_Weapon, 0, NUM_WEAPONS-1)) return -1;
		if(!CheckInt("m_Emote", pObj->m_Emote, 0, 5)) return -1;
		if(!CheckInt("m_AttackTick", pObj->m_AttackTick, 0, max_int)) return -1;
		if(!CheckFlag("m_TriggeredEvents", pObj->m_TriggeredEvents, COREEVENTFLAG_GROUND_JUMP|COREEVENTFLAG_AIR_JUMP|COREEVENTFLAG_HOOK_ATTACH_PLAYER|COREEVENTFLAG_HOOK_ATTACH_GROUND|COREEVENTFLAG_HOOK_HIT_NOHOOK)) return -1;
		if(!CheckInt("m_Tick", pObj->m_Tick, 0, max_int)) return -1;
		if(!CheckInt("m_Direction", pObj->m_Direction, -1, 1)) return -1;
		if(!CheckInt("m_Jumped", pObj->m_Jumped, 0, 3)) return -1;
		if(!CheckInt("m_HookedPlayer", pObj->m_HookedPlayer, -1, MAX_CLIENTS-1)) return -1;
		if(!CheckInt("m_HookState", pObj->m_HookState, -1, 5)) return -1;
		if(!CheckInt("m_HookTick", pObj->m_HookTick, 0, max_int)) return -1;
		return 0;
	}
	
	case NETOBJTYPE_PLAYERINFO:
	{
		const CNetObj_PlayerInfo *pObj = (const CNetObj_PlayerInfo *)pData;
		if(sizeof(*pObj) != Size) return -1;
		if(!CheckFlag("m_PlayerFlags", pObj->m_PlayerFlags, PLAYERFLAG_ADMIN|PLAYERFLAG_CHATTING|PLAYERFLAG_SCOREBOARD|PLAYERFLAG_READY|PLAYERFLAG_DEAD|PLAYERFLAG_WATCHING|PLAYERFLAG_BOT)) return -1;
		return 0;
	}
	
	case NETOBJTYPE_SPECTATORINFO:
	{
		const CNetObj_SpectatorInfo *pObj = (const CNetObj_SpectatorInfo *)pData;
		if(sizeof(*pObj) != Size) return -1;
		if(!CheckInt("m_SpecMode", pObj->m_SpecMode, 0, NUM_SPECMODES-1)) return -1;
		if(!CheckInt("m_SpectatorID", pObj->m_SpectatorID, -1, MAX_CLIENTS-1)) return -1;
		return 0;
	}
	
	case NETOBJTYPE_DE_CLIENTINFO:
	{
		const CNetObj_De_ClientInfo *pObj = (const CNetObj_De_ClientInfo *)pData;
		if(sizeof(*pObj) != Size) return -1;
		if(!CheckInt("m_Local", pObj->m_Local, 0, 1)) return -1;
		if(!CheckInt("m_Team", pObj->m_Team, TEAM_SPECTATORS, TEAM_BLUE)) return -1;
		if(!CheckInt("m_aUseCustomColors[0]", pObj->m_aUseCustomColors[0], 0, 1)) return -1;
		if(!CheckInt("m_aUseCustomColors[1]", pObj->m_aUseCustomColors[1], 0, 1)) return -1;
		if(!CheckInt("m_aUseCustomColors[2]", pObj->m_aUseCustomColors[2], 0, 1)) return -1;
		if(!CheckInt("m_aUseCustomColors[3]", pObj->m_aUseCustomColors[3], 0, 1)) return -1;
		if(!CheckInt("m_aUseCustomColors[4]", pObj->m_aUseCustomColors[4], 0, 1)) return -1;
		if(!CheckInt("m_aUseCustomColors[5]", pObj->m_aUseCustomColors[5], 0, 1)) return -1;
		return 0;
	}
	
	case NETOBJTYPE_DE_GAMEINFO:
	{
		const CNetObj_De_GameInfo *pObj = (const CNetObj_De_GameInfo *)pData;
		if(sizeof(*pObj) != Size) return -1;
		if(!CheckFlag("m_GameFlags", pObj->m_GameFlags, GAMEFLAG_TEAMS|GAMEFLAG_FLAGS|GAMEFLAG_SURVIVAL|GAMEFLAG_RACE)) return -1;
		if(!CheckInt("m_ScoreLimit", pObj->m_ScoreLimit, 0, max_int)) return -1;
		if(!CheckInt("m_TimeLimit", pObj->m_TimeLimit, 0, max_int)) return -1;
		if(!CheckInt("m_MatchNum", pObj->m_MatchNum, 0, max_int)) return -1;
		if(!CheckInt("m_MatchCurrent", pObj->m_MatchCurrent, 0, max_int)) return -1;
		return 0;
	}
	
	case NETOBJTYPE_DE_TUNEPARAMS:
	{
		const CNetObj_De_TuneParams *pObj = (const CNetObj_De_TuneParams *)pData;
		if(sizeof(*pObj) != Size) return -1;
		return 0;
	}
	
	case NETEVENTTYPE_COMMON:
	{
		const CNetEvent_Common *pObj = (const CNetEvent_Common *)pData;
		if(sizeof(*pObj) != Size) return -1;
		return 0;
	}
	
	case NETEVENTTYPE_EXPLOSION:
	{
		const CNetEvent_Explosion *pObj = (const CNetEvent_Explosion *)pData;
		if(sizeof(*pObj) != Size) return -1;
		return 0;
	}
	
	case NETEVENTTYPE_SPAWN:
	{
		const CNetEvent_Spawn *pObj = (const CNetEvent_Spawn *)pData;
		if(sizeof(*pObj) != Size) return -1;
		return 0;
	}
	
	case NETEVENTTYPE_HAMMERHIT:
	{
		const CNetEvent_HammerHit *pObj = (const CNetEvent_HammerHit *)pData;
		if(sizeof(*pObj) != Size) return -1;
		return 0;
	}
	
	case NETEVENTTYPE_DEATH:
	{
		const CNetEvent_Death *pObj = (const CNetEvent_Death *)pData;
		if(sizeof(*pObj) != Size) return -1;
		if(!CheckInt("m_ClientID", pObj->m_ClientID, 0, MAX_CLIENTS-1)) return -1;
		return 0;
	}
	
	case NETEVENTTYPE_SOUNDWORLD:
	{
		const CNetEvent_SoundWorld *pObj = (const CNetEvent_SoundWorld *)pData;
		if(sizeof(*pObj) != Size) return -1;
		if(!CheckInt("m_SoundID", pObj->m_SoundID, 0, NUM_SOUNDS-1)) return -1;
		return 0;
	}
	
	case NETEVENTTYPE_DAMAGE:
	{
		const CNetEvent_Damage *pObj = (const CNetEvent_Damage *)pData;
		if(sizeof(*pObj) != Size) return -1;
		if(!CheckInt("m_ClientID", pObj->m_ClientID, 0, MAX_CLIENTS-1)) return -1;
		if(!CheckInt("m_HealthAmount", pObj->m_HealthAmount, 0, 9)) return -1;
		if(!CheckInt("m_ArmorAmount", pObj->m_ArmorAmount, 0, 9)) return -1;
		if(!CheckInt("m_Self", pObj->m_Self, 0, 1)) return -1;
		return 0;
	}
	
	case NETOBJTYPE_PLAYERINFORACE:
	{
		const CNetObj_PlayerInfoRace *pObj = (const CNetObj_PlayerInfoRace *)pData;
		if(sizeof(*pObj) != Size) return -1;
		if(!CheckInt("m_RaceStartTick", pObj->m_RaceStartTick, 0, max_int)) return -1;
		return 0;
	}
	
	case NETOBJTYPE_GAMEDATARACE:
	{
		const CNetObj_GameDataRace *pObj = (const CNetObj_GameDataRace *)pData;
		if(sizeof(*pObj) != Size) return -1;
		if(!CheckInt("m_BestTime", pObj->m_BestTime, -1, max_int)) return -1;
		if(!CheckInt("m_Precision", pObj->m_Precision, 0, 3)) return -1;
		if(!CheckFlag("m_RaceFlags", pObj->m_RaceFlags, RACEFLAG_HIDE_KILLMSG|RACEFLAG_FINISHMSG_AS_CHAT|RACEFLAG_KEEP_WANTED_WEAPON)) return -1;
		return 0;
	}
	
	}
	return -1;
}